

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_pasv_resp(connectdata *conn,int ftpcode)

{
  curl_strdup_callback p_Var1;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  int local_80;
  short local_7c [2];
  int port [2];
  int ip [4];
  int i;
  uint uStack_5c;
  char sep1;
  char separator [4];
  uint num;
  char *ptr;
  char *str;
  unsigned_short connectport;
  Curl_dns_entry *pCStack_40;
  int rc;
  Curl_dns_entry *addr;
  SessionHandle *data;
  anon_union_224_10_26c073a1_for_proto *paStack_28;
  CURLcode result;
  ftp_conn *ftpc;
  connectdata *pcStack_18;
  int ftpcode_local;
  connectdata *conn_local;
  
  paStack_28 = &conn->proto;
  addr = (Curl_dns_entry *)conn->data;
  pCStack_40 = (Curl_dns_entry *)0x0;
  ptr = (((SessionHandle *)addr)->state).buffer + 4;
  ftpc._4_4_ = ftpcode;
  pcStack_18 = conn;
  (*Curl_cfree)((conn->proto).ftpc.newhost);
  (paStack_28->ftpc).newhost = (char *)0x0;
  if (((paStack_28->ftpc).count1 == 0) && (ftpc._4_4_ == 0xe5)) {
    _separator = strchr(ptr,0x28);
    if (_separator != (char *)0x0) {
      _separator = _separator + 1;
      iVar2 = __isoc99_sscanf(_separator,"%c%c%c%u%c",&i,(long)&i + 1,(long)&i + 2,
                              &stack0xffffffffffffffa4,(long)&i + 3);
      if (iVar2 == 5) {
        ip[3]._3_1_ = (char)i;
        for (ip[2] = 1; ip[2] < 4; ip[2] = ip[2] + 1) {
          if (*(char *)((long)&i + (long)ip[2]) != (char)i) {
            _separator = (char *)0x0;
            break;
          }
        }
        if (0xffff < uStack_5c) {
          Curl_failf((SessionHandle *)addr,"Illegal port number in EPSV reply");
          return CURLE_FTP_WEIRD_PASV_REPLY;
        }
        if (_separator != (char *)0x0) {
          (paStack_28->ftpc).newport = (unsigned_short)uStack_5c;
          p_Var1 = Curl_cstrdup;
          pcVar4 = control_address(pcStack_18);
          pcVar4 = (*p_Var1)(pcVar4);
          (paStack_28->ftpc).newhost = pcVar4;
          if ((paStack_28->ftpc).newhost == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
      }
      else {
        _separator = (char *)0x0;
      }
    }
    if (_separator == (char *)0x0) {
      Curl_failf((SessionHandle *)addr,"Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else {
    if (((paStack_28->ftpc).count1 != 1) || (ftpc._4_4_ != 0xe3)) {
      if ((paStack_28->ftpc).count1 == 0) {
        CVar3 = ftp_epsv_disable(pcStack_18);
        return CVar3;
      }
      Curl_failf((SessionHandle *)addr,"Bad PASV/EPSV response: %03d",(ulong)ftpc._4_4_);
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
    for (; *ptr != '\0'; ptr = ptr + 1) {
      iVar2 = __isoc99_sscanf(ptr,"%d,%d,%d,%d,%d,%d",port,port + 1,ip,ip + 1,&local_80,local_7c);
      if (iVar2 == 6) break;
    }
    if (*ptr == '\0') {
      Curl_failf((SessionHandle *)addr,"Couldn\'t interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }
    if (((ulong)addr[0x32].addr & 1) == 0) {
      pcVar4 = curl_maprintf("%d.%d.%d.%d",(ulong)(uint)port[0],(ulong)(uint)port[1],
                             (ulong)(uint)ip[0],(ulong)(uint)ip[1]);
      (paStack_28->ftpc).newhost = pcVar4;
    }
    else {
      Curl_infof((SessionHandle *)addr,"Skip %d.%d.%d.%d for data connection, re-use %s instead\n",
                 (ulong)(uint)port[0],(ulong)(uint)port[1],(ulong)(uint)ip[0],(ulong)(uint)ip[1],
                 (pcStack_18->host).name);
      p_Var1 = Curl_cstrdup;
      pcVar4 = control_address(pcStack_18);
      pcVar4 = (*p_Var1)(pcVar4);
      (paStack_28->ftpc).newhost = pcVar4;
    }
    if ((paStack_28->ftpc).newhost == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (paStack_28->ftpc).newport = (short)(local_80 << 8) + local_7c[0];
  }
  if (((pcStack_18->bits).proxy & 1U) == 0) {
    Curl_resolv(pcStack_18,(paStack_28->ftpc).newhost,(uint)(paStack_28->ftpc).newport,
                &stack0xffffffffffffffc0);
    str._2_2_ = (paStack_28->ftpc).newport;
    if (pCStack_40 == (Curl_dns_entry *)0x0) {
      Curl_failf((SessionHandle *)addr,"Can\'t resolve new host %s:%hu",(paStack_28->ftpc).newhost,
                 (ulong)str._2_2_);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }
  else {
    Curl_resolv(pcStack_18,(pcStack_18->proxy).name,(int)pcStack_18->port,&stack0xffffffffffffffc0);
    str._2_2_ = (ushort)pcStack_18->port;
    if (pCStack_40 == (Curl_dns_entry *)0x0) {
      Curl_failf((SessionHandle *)addr,"Can\'t resolve proxy host %s:%hu",(pcStack_18->proxy).name,
                 pcStack_18->port & 0xffff);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }
  (pcStack_18->bits).tcpconnect[1] = false;
  data._4_4_ = Curl_connecthost(pcStack_18,pCStack_40);
  if (data._4_4_ == CURLE_OK) {
    if (((ulong)addr[0x31].addr & 1) != 0) {
      ftp_pasv_verbose(pcStack_18,pCStack_40->addr,(paStack_28->ftpc).newhost,(uint)str._2_2_);
    }
    Curl_resolv_unlock((SessionHandle *)addr,pCStack_40);
    (pcStack_18->bits).do_more = true;
    _state(pcStack_18,FTP_STOP);
    conn_local._4_4_ = data._4_4_;
  }
  else {
    Curl_resolv_unlock((SessionHandle *)addr,pCStack_40);
    if (((paStack_28->ftpc).count1 == 0) && (ftpc._4_4_ == 0xe5)) {
      conn_local._4_4_ = ftp_epsv_disable(pcStack_18);
    }
    else {
      conn_local._4_4_ = data._4_4_;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode ftp_state_pasv_resp(struct connectdata *conn,
                                    int ftpcode)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  struct SessionHandle *data=conn->data;
  struct Curl_dns_entry *addr=NULL;
  int rc;
  unsigned short connectport; /* the local port connect() should use! */
  char *str=&data->state.buffer[4];  /* start on the first letter */

  /* if we come here again, make sure the former name is cleared */
  Curl_safefree(ftpc->newhost);

  if((ftpc->count1 == 0) &&
     (ftpcode == 229)) {
    /* positive EPSV response */
    char *ptr = strchr(str, '(');
    if(ptr) {
      unsigned int num;
      char separator[4];
      ptr++;
      if(5 == sscanf(ptr, "%c%c%c%u%c",
                     &separator[0],
                     &separator[1],
                     &separator[2],
                     &num,
                     &separator[3])) {
        const char sep1 = separator[0];
        int i;

        /* The four separators should be identical, or else this is an oddly
           formatted reply and we bail out immediately. */
        for(i=1; i<4; i++) {
          if(separator[i] != sep1) {
            ptr=NULL; /* set to NULL to signal error */
            break;
          }
        }
        if(num > 0xffff) {
          failf(data, "Illegal port number in EPSV reply");
          return CURLE_FTP_WEIRD_PASV_REPLY;
        }
        if(ptr) {
          ftpc->newport = (unsigned short)(num & 0xffff);
          ftpc->newhost = strdup(control_address(conn));
          if(!ftpc->newhost)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else
        ptr=NULL;
    }
    if(!ptr) {
      failf(data, "Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else if((ftpc->count1 == 1) &&
          (ftpcode == 227)) {
    /* positive PASV response */
    int ip[4];
    int port[2];

    /*
     * Scan for a sequence of six comma-separated numbers and use them as
     * IP+port indicators.
     *
     * Found reply-strings include:
     * "227 Entering Passive Mode (127,0,0,1,4,51)"
     * "227 Data transfer will passively listen to 127,0,0,1,4,51"
     * "227 Entering passive mode. 127,0,0,1,4,51"
     */
    while(*str) {
      if(6 == sscanf(str, "%d,%d,%d,%d,%d,%d",
                     &ip[0], &ip[1], &ip[2], &ip[3],
                     &port[0], &port[1]))
        break;
      str++;
    }

    if(!*str) {
      failf(data, "Couldn't interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }

    /* we got OK from server */
    if(data->set.ftp_skip_ip) {
      /* told to ignore the remotely given IP but instead use the host we used
         for the control connection */
      infof(data, "Skip %d.%d.%d.%d for data connection, re-use %s instead\n",
            ip[0], ip[1], ip[2], ip[3],
            conn->host.name);
      ftpc->newhost = strdup(control_address(conn));
    }
    else
      ftpc->newhost = aprintf("%d.%d.%d.%d", ip[0], ip[1], ip[2], ip[3]);

    if(!ftpc->newhost)
      return CURLE_OUT_OF_MEMORY;

    ftpc->newport = (unsigned short)(((port[0]<<8) + port[1]) & 0xffff);
  }
  else if(ftpc->count1 == 0) {
    /* EPSV failed, move on to PASV */
    return ftp_epsv_disable(conn);
  }
  else {
    failf(data, "Bad PASV/EPSV response: %03d", ftpcode);
    return CURLE_FTP_WEIRD_PASV_REPLY;
  }

  if(conn->bits.proxy) {
    /*
     * This connection uses a proxy and we need to connect to the proxy again
     * here. We don't want to rely on a former host lookup that might've
     * expired now, instead we remake the lookup here and now!
     */
    rc = Curl_resolv(conn, conn->proxy.name, (int)conn->port, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING, ignores the return code but 'addr' will be NULL in
         case of failure */
      (void)Curl_resolver_wait_resolv(conn, &addr);

    connectport =
      (unsigned short)conn->port; /* we connect to the proxy's port */

    if(!addr) {
      failf(data, "Can't resolve proxy host %s:%hu",
            conn->proxy.name, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }
  else {
    /* normal, direct, ftp connection */
    rc = Curl_resolv(conn, ftpc->newhost, ftpc->newport, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING */
      (void)Curl_resolver_wait_resolv(conn, &addr);

    connectport = ftpc->newport; /* we connect to the remote port */

    if(!addr) {
      failf(data, "Can't resolve new host %s:%hu", ftpc->newhost, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }

  conn->bits.tcpconnect[SECONDARYSOCKET] = FALSE;
  result = Curl_connecthost(conn, addr);

  if(result) {
    Curl_resolv_unlock(data, addr); /* we're done using this address */
    if(ftpc->count1 == 0 && ftpcode == 229)
      return ftp_epsv_disable(conn);

    return result;
  }


  /*
   * When this is used from the multi interface, this might've returned with
   * the 'connected' set to FALSE and thus we are now awaiting a non-blocking
   * connect to connect.
   */

  if(data->set.verbose)
    /* this just dumps information about this second connection */
    ftp_pasv_verbose(conn, addr->addr, ftpc->newhost, connectport);

  Curl_resolv_unlock(data, addr); /* we're done using this address */
  conn->bits.do_more = TRUE;
  state(conn, FTP_STOP); /* this phase is completed */

  return result;
}